

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O0

void __thiscall QWhatsThisPrivate::QWhatsThisPrivate(QWhatsThisPrivate *this)

{
  byte bVar1;
  bool bVar2;
  QCoreApplication *pQVar3;
  QWidget *pQVar4;
  CursorShape CVar5;
  QWhatsThisPrivate *in_RDI;
  long in_FS_OFFSET;
  bool sentEvent;
  QWidget *w;
  QHelpEvent e;
  QPoint pos;
  QAccessibleEvent event;
  byte local_89;
  QWhatsThisPrivate *pQVar6;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  QCursor local_68;
  QCursor local_60;
  QPoint *in_stack_ffffffffffffffa8;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject(&in_RDI->super_QObject,(QObject *)0x0);
  *(undefined ***)in_RDI = &PTR_metaObject_00d0db30;
  pQVar6 = in_RDI;
  QPointer<QAction>::QPointer((QPointer<QAction> *)0x4c3cf0);
  instance = pQVar6;
  instance->leaveOnMouseRelease = false;
  pQVar6 = instance;
  pQVar3 = QCoreApplication::instance();
  QObject::installEventFilter((QObject *)pQVar3);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = (undefined1 *)QCursor::pos();
  pQVar4 = QApplication::widgetAt(in_stack_ffffffffffffffa8);
  if (pQVar4 == (QWidget *)0x0) {
    QCursor::QCursor(&local_68,WhatsThisCursor);
    QGuiApplication::setOverrideCursor(&local_68);
    QCursor::~QCursor(&local_68);
  }
  else {
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::mapFromGlobal
              ((QWidget *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               (QPoint *)pQVar6);
    QHelpEvent::QHelpEvent
              ((QHelpEvent *)&local_50,QueryWhatsThis,(QPoint *)&stack0xffffffffffffffa8,
               (QPoint *)&local_30);
    bVar1 = QCoreApplication::sendEvent(&pQVar4->super_QObject,(QEvent *)&local_50);
    local_89 = 1;
    if ((bVar1 & 1) != 0) {
      bVar2 = QEvent::isAccepted((QEvent *)&local_50);
      local_89 = bVar2 ^ 0xff;
    }
    CVar5 = WhatsThisCursor;
    if ((local_89 & 1) != 0) {
      CVar5 = ForbiddenCursor;
    }
    QCursor::QCursor(&local_60,CVar5);
    QGuiApplication::setOverrideCursor(&local_60);
    QCursor::~QCursor(&local_60);
    QHelpEvent::~QHelpEvent((QHelpEvent *)&local_50);
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QAccessibleEvent::QAccessibleEvent
            ((QAccessibleEvent *)&local_28,&pQVar6->super_QObject,ContextHelpStart);
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_28);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWhatsThisPrivate::QWhatsThisPrivate()
    : leaveOnMouseRelease(false)
{
    instance = this;
    qApp->installEventFilter(this);

    QPoint pos = QCursor::pos();
    if (QWidget *w = QApplication::widgetAt(pos)) {
        QHelpEvent e(QEvent::QueryWhatsThis, w->mapFromGlobal(pos), pos);
        const bool sentEvent = QCoreApplication::sendEvent(w, &e);
#ifdef QT_NO_CURSOR
        Q_UNUSED(sentEvent);
#else
        QGuiApplication::setOverrideCursor((!sentEvent || !e.isAccepted())?
                                        Qt::ForbiddenCursor:Qt::WhatsThisCursor);
    } else {
        QGuiApplication::setOverrideCursor(Qt::WhatsThisCursor);
#endif
    }
#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::ContextHelpStart);
    QAccessible::updateAccessibility(&event);
#endif
}